

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
TagVisitor<XamlTag,_cmGeneratorTarget::XamlData>::Accept
          (TagVisitor<XamlTag,_cmGeneratorTarget::XamlData> *this,cmSourceFile *sf)

{
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  cmGlobalGenerator *this_00;
  cmSourceFile *this_01;
  bool bVar3;
  int iVar4;
  string *psVar5;
  cmCustomCommand *pcVar6;
  string ext;
  cmSourceFile *local_68;
  string local_60;
  string local_40;
  
  local_68 = sf;
  psVar5 = cmSourceFile::GetExtension_abi_cxx11_(sf);
  cmsys::SystemTools::LowerCase(&local_40,psVar5);
  pcVar6 = cmSourceFile::GetCustomCommand(sf);
  if ((pcVar6 == (cmCustomCommand *)0x0) && (this->Target->TargetTypeValue != UTILITY)) {
    paVar2 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"HEADER_FILE_ONLY","");
    bVar3 = cmSourceFile::GetPropertyAsBool(sf,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    this_01 = local_68;
    if (!bVar3) {
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"EXTERNAL_OBJECT","");
      bVar3 = cmSourceFile::GetPropertyAsBool(this_01,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        if (this->IsObjLib == true) {
          __position._M_current =
               (this->BadObjLibFiles).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->BadObjLibFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->BadObjLibFiles,
                       __position,&local_68);
          }
          else {
            *__position._M_current = local_68;
            pppcVar1 = &(this->BadObjLibFiles).
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
      }
      else {
        cmSourceFile::GetLanguage_abi_cxx11_(&local_60,local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_60._M_string_length == 0) {
          iVar4 = std::__cxx11::string::compare((char *)&local_40);
          if (iVar4 == 0) {
            if (this->IsObjLib == false) goto LAB_00396ed7;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_40);
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::string::compare((char *)&local_40);
              if (((iVar4 != 0) &&
                  (iVar4 = std::__cxx11::string::compare((char *)&local_40), iVar4 != 0)) &&
                 (iVar4 = std::__cxx11::string::compare((char *)&local_40), iVar4 != 0)) {
                iVar4 = std::__cxx11::string::compare((char *)&local_40);
                if (iVar4 == 0) {
                  DoAccept<true>::Do(this->Data,local_68);
                }
                else {
                  psVar5 = cmSourceFile::GetFullPath(local_68,(string *)0x0);
                  bVar3 = cmsys::RegularExpression::find(&this->Header,(psVar5->_M_dataplus)._M_p);
                  if (!bVar3) {
                    this_00 = this->GlobalGenerator;
                    psVar5 = cmSourceFile::GetExtension_abi_cxx11_(local_68);
                    cmGlobalGenerator::IgnoreFile(this_00,(psVar5->_M_dataplus)._M_p);
                  }
                }
              }
              goto LAB_00396ed7;
            }
            if (this->IsObjLib != true) goto LAB_00396ed7;
          }
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                    (&this->BadObjLibFiles,&local_68);
        }
      }
    }
  }
LAB_00396ed7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Accept(cmSourceFile *sf)
  {
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if(sf->GetCustomCommand())
      {
      DoAccept<IsSameTag<Tag, CustomCommandsTag>::Result>::Do(this->Data, sf);
      }
    else if(this->Target->GetType() == cmTarget::UTILITY)
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(sf->GetPropertyAsBool("HEADER_FILE_ONLY"))
      {
      DoAccept<IsSameTag<Tag, HeaderSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(sf->GetPropertyAsBool("EXTERNAL_OBJECT"))
      {
      DoAccept<IsSameTag<Tag, ExternalObjectsTag>::Result>::Do(this->Data, sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(!sf->GetLanguage().empty())
      {
      DoAccept<IsSameTag<Tag, ObjectSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(ext == "def")
      {
      DoAccept<IsSameTag<Tag, ModuleDefinitionFileTag>::Result>::Do(this->Data,
                                                                    sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(ext == "idl")
      {
      DoAccept<IsSameTag<Tag, IDLSourcesTag>::Result>::Do(this->Data, sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(ext == "resx")
      {
      DoAccept<IsSameTag<Tag, ResxTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "appxmanifest")
      {
      DoAccept<IsSameTag<Tag, AppManifestTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "pfx")
      {
      DoAccept<IsSameTag<Tag, CertificatesTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "xaml")
      {
      DoAccept<IsSameTag<Tag, XamlTag>::Result>::Do(this->Data, sf);
      }
    else if(this->Header.find(sf->GetFullPath().c_str()))
      {
      DoAccept<IsSameTag<Tag, HeaderSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(this->GlobalGenerator->IgnoreFile(sf->GetExtension().c_str()))
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
    else
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
  }